

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt_string.c
# Opt level: O1

int dropt_strnicmp(dropt_char *s,dropt_char *t,size_t n)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  __int32_t **pp_Var5;
  size_t sVar6;
  
  if (s == (dropt_char *)0x0) {
    __assert_fail("s != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_string.c"
                  ,0x10e,"int dropt_strnicmp(const dropt_char *, const dropt_char *, size_t)");
  }
  if (t != (dropt_char *)0x0) {
    if (n != 0 && s != t) {
      sVar6 = 0;
      do {
        cVar1 = s[sVar6];
        if (((long)cVar1 == 0) && (t[sVar6] == '\0')) {
          return 0;
        }
        cVar2 = t[sVar6];
        if (cVar1 != cVar2) {
          pp_Var5 = __ctype_tolower_loc();
          iVar3 = (*pp_Var5)[cVar2];
          iVar4 = (*pp_Var5)[cVar1];
          if (iVar4 != iVar3) {
            return (uint)(iVar3 <= iVar4) * 2 + -1;
          }
        }
        sVar6 = sVar6 + 1;
      } while (n != sVar6);
    }
    return 0;
  }
  __assert_fail("t != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_string.c"
                ,0x10f,"int dropt_strnicmp(const dropt_char *, const dropt_char *, size_t)");
}

Assistant:

int
dropt_strnicmp(const dropt_char* s, const dropt_char* t, size_t n)
{
    assert(s != NULL);
    assert(t != NULL);

    if (s == t) { return 0; }

    while (n--)
    {
        if (*s == DROPT_TEXT_LITERAL('\0') && *t == DROPT_TEXT_LITERAL('\0'))
        {
            break;
        }
        else if (*s == *t || dropt_tolower(*s) == dropt_tolower(*t))
        {
            s++;
            t++;
        }
        else
        {
            return (dropt_tolower(*s) < dropt_tolower(*t))
                   ? -1
                   : +1;
        }
    }

    return 0;
}